

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O0

void __thiscall
cmLocalGenerator::UpdateOutputToSourceMap
          (cmLocalGenerator *this,string *output,cmSourceFile *source,OutputRole role,
          cmListFileBacktrace *bt,cmCommandOrigin origin)

{
  pointer ppVar1;
  pair<std::__detail::_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmLocalGenerator::SourceEntry>,_false,_true>,_bool>
  pVar2;
  SourceEntry *current;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmLocalGenerator::SourceEntry>,_true>
  local_60;
  pair<std::__detail::_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmLocalGenerator::SourceEntry>,_false,_true>,_bool>
  pr;
  SourceEntry entry;
  cmCommandOrigin origin_local;
  cmListFileBacktrace *bt_local;
  OutputRole role_local;
  cmSourceFile *source_local;
  string *output_local;
  cmLocalGenerator *this_local;
  
  SourceEntry::SourceEntry((SourceEntry *)&pr.second);
  pVar2 = std::
          unordered_map<std::__cxx11::string,cmLocalGenerator::SourceEntry,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmLocalGenerator::SourceEntry>>>
          ::emplace<std::__cxx11::string_const&,cmLocalGenerator::SourceEntry&>
                    ((unordered_map<std::__cxx11::string,cmLocalGenerator::SourceEntry,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmLocalGenerator::SourceEntry>>>
                      *)&this->OutputToSource,output,(SourceEntry *)&pr.second);
  local_60._M_cur =
       (__node_type *)
       pVar2.first.
       super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmLocalGenerator::SourceEntry>,_true>
       ._M_cur;
  pr.first.
  super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmLocalGenerator::SourceEntry>,_true>
  ._M_cur._0_1_ = pVar2.second;
  if (((undefined1  [16])pVar2 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
    ppVar1 = std::__detail::
             _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmLocalGenerator::SourceEntry>,_false,_true>
             ::operator->((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmLocalGenerator::SourceEntry>,_false,_true>
                           *)&local_60);
    if (((ppVar1->second).Sources.Source == (cmSourceFile *)0x0) ||
       ((((ppVar1->second).Sources.SourceIsByproduct & 1U) != 0 && (role == Primary)))) {
      (ppVar1->second).Sources.Source = source;
      (ppVar1->second).Sources.SourceIsByproduct = false;
    }
  }
  else {
    anon_unknown.dwarf_dbceda::CreateGeneratedSource(this,output,role,origin,bt);
  }
  return;
}

Assistant:

void cmLocalGenerator::UpdateOutputToSourceMap(std::string const& output,
                                               cmSourceFile* source,
                                               OutputRole role,
                                               cmListFileBacktrace const& bt,
                                               cmCommandOrigin origin)
{
  SourceEntry entry;
  entry.Sources.Source = source;
  entry.Sources.SourceIsByproduct = role == OutputRole::Byproduct;

  auto pr = this->OutputToSource.emplace(output, entry);
  if (pr.second) {
    CreateGeneratedSource(*this, output, role, origin, bt);
  } else {
    SourceEntry& current = pr.first->second;
    // Outputs take precedence over byproducts
    if (!current.Sources.Source ||
        (current.Sources.SourceIsByproduct && role == OutputRole::Primary)) {
      current.Sources.Source = source;
      current.Sources.SourceIsByproduct = false;
    } else {
      // Multiple custom commands produce the same output but may
      // be attached to a different source file (MAIN_DEPENDENCY).
      // LinearGetSourceFileWithOutput would return the first one,
      // so keep the mapping for the first one.
      //
      // TODO: Warn the user about this case.  However, the VS 8 generator
      // triggers it for separate generate.stamp rules in ZERO_CHECK and
      // individual targets.
    }
  }
}